

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.h
# Opt level: O0

Type * __thiscall
mnf::Manifold::getView<1,0>
          (Type *__return_storage_ptr__,Manifold *this,RefMat *val,size_t ir,size_t ic)

{
  Index startRow;
  Index startCol;
  Index blockRows;
  Index blockCols;
  size_t ic_local;
  size_t ir_local;
  RefMat *val_local;
  Manifold *this_local;
  
  startRow = getStart<1>(this,ir);
  startCol = getStart<0>(this,ic);
  blockRows = getDim<1>(this,ir);
  blockCols = getDim<0>(this,ic);
  Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>>::
  block<long,long>(__return_storage_ptr__,
                   (DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>>
                    *)val,startRow,startCol,blockRows,blockCols);
  return __return_storage_ptr__;
}

Assistant:

inline typename ViewReturnType<Dr, Dc>::Type Manifold::getView(RefMat val,
                                                               size_t ir,
                                                               size_t ic) const
{
  return val.block(getStart<Dr>(ir), getStart<Dc>(ic), getDim<Dr>(ir),
                   getDim<Dc>(ic));
}